

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_estimator.c
# Opt level: O3

void WebRtcIsac_InitializePitch
               (double *in,double old_lag,double old_gain,PitchAnalysisStruct *State,double *lags)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  undefined1 *puVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  undefined1 *puVar25;
  ulong uVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar35;
  double dVar36;
  undefined1 auVar34 [16];
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  int peaks [10];
  double *CorrSurf [25];
  double peak_vals [10];
  double corrvec1 [65];
  double corrvec2 [65];
  double buf_dec [192];
  double corrSurfBuff [1735];
  double adStack_4278 [10];
  double adStack_4228 [10];
  int aiStack_41d8 [10];
  long alStack_41b0 [27];
  double adStack_40d8 [10];
  double local_4088 [9];
  undefined1 local_4040 [8];
  double adStack_4038 [56];
  double local_3e78 [9];
  undefined1 local_3e30 [8];
  double adStack_3e28 [56];
  double local_3c68 [60];
  double local_3a88 [10];
  double adStack_3a38 [50];
  undefined1 local_38a8 [576];
  undefined1 local_3668 [13880];
  
  lVar14 = 1;
  auVar34 = _DAT_0019dd50;
  do {
    uVar26 = auVar34._8_8_;
    if (SUB164(auVar34 ^ _DAT_0019c620,4) == -0x80000000 &&
        SUB164(auVar34 ^ _DAT_0019c620,0) < -0x7fffffe7) {
      alStack_41b0[lVar14] =
           (long)(local_3668 +
                 (((auVar34._0_8_ >> 0x20) * 0x45 << 0x20) + (ulong)auVar34._0_4_ * 0x45 + 10) * 8);
      alStack_41b0[lVar14 + 1] =
           (long)(local_3668 +
                 (((uVar26 >> 0x20) * 0x45 << 0x20) + (uVar26 & 0xffffffff) * 0x45 + 10) * 8);
    }
    auVar34._0_8_ = auVar34._0_8_ + 2;
    auVar34._8_8_ = uVar26 + 2;
    lVar14 = lVar14 + 2;
  } while (lVar14 != 0x1b);
  memset(local_3668,0,0x3638);
  memcpy(adStack_3e28 + 0x38,State,0x240);
  WebRtcIsac_DecimateAllpass(in,State->decimator_state,0xf0,adStack_3a38 + 2);
  lVar14 = 0x48;
  do {
    adStack_3a38[1] =
         adStack_3a38[1] * 0.75 + adStack_3e28[lVar14 + 0x36] * -0.25 + adStack_3e28[lVar14 + 0x38];
    adStack_3e28[lVar14 + 0x38] = adStack_3a38[1];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0xc0);
  memcpy(State,local_38a8,0x240);
  PCorr(adStack_3e28 + 0x38,local_4088);
  PCorr(local_3a88,local_3e78);
  dVar27 = log(old_lag * 0.5);
  dVar28 = old_gain * 4.0 * old_gain;
  dVar37 = 0.8;
  if (dVar28 <= 0.8) {
    dVar37 = dVar28;
  }
  lVar14 = 0;
  do {
    dVar28 = log((double)((int)lVar14 + 8));
    dVar28 = exp((dVar28 - dVar27) * (dVar28 - dVar27) * -5.0);
    local_4088[lVar14] = (dVar28 * dVar37 + 1.0) * local_4088[lVar14];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x41);
  lVar14 = 0x200;
  lVar16 = 0;
  do {
    dVar37 = *(double *)((long)&DAT_001a5fc0 + lVar16);
    *(double *)((long)local_4088 + lVar16) = *(double *)((long)local_4088 + lVar16) * dVar37;
    *(double *)((long)local_3e78 + lVar16) = *(double *)((long)local_3e78 + lVar16) * dVar37;
    *(double *)((long)local_4088 + lVar14) = *(double *)((long)local_4088 + lVar14) * dVar37;
    *(double *)((long)local_3e78 + lVar14) = dVar37 * *(double *)((long)local_3e78 + lVar14);
    lVar14 = lVar14 + -8;
    lVar16 = lVar16 + 8;
  } while (lVar16 != 0x18);
  lVar14 = 0;
  uVar26 = 0;
  dVar37 = 0.0;
  do {
    dVar27 = *(double *)((long)local_4088 + lVar14) + *(double *)((long)local_3e78 + lVar14);
    if (dVar37 < dVar27) {
      uVar26 = (ulong)((alStack_41b0[0xc] - alStack_41b0[1]) + 0x10 + lVar14) >> 3 & 0xffffffff;
    }
    *(double *)(alStack_41b0[0xc] + 0x10 + lVar14) = dVar27;
    if (dVar27 <= dVar37) {
      dVar27 = dVar37;
    }
    lVar14 = lVar14 + 8;
    dVar37 = dVar27;
  } while (lVar14 != 0x208);
  uVar17 = (alStack_41b0[0x17] - alStack_41b0[1]) + 0x68;
  lVar14 = 0;
  do {
    iVar22 = (int)lVar14;
    dVar37 = (double)(iVar22 + 0xc) / (double)(iVar22 + 0x17);
    dVar37 = dVar37 * 0.2 * (2.0 - dVar37);
    dVar28 = (local_4088[lVar14] + adStack_3e28[lVar14 + 1]) * dVar37;
    uVar20 = (ulong)(iVar22 + 2);
    if (dVar28 <= dVar27) {
      uVar20 = uVar26;
    }
    *(double *)(alStack_41b0[1] + 0x10 + lVar14 * 8) = dVar28;
    if (dVar28 <= dVar27) {
      dVar28 = dVar27;
    }
    dVar27 = (adStack_4038[lVar14 + 1] + local_3e78[lVar14]) * dVar37;
    *(double *)(alStack_41b0[0x17] + 0x68 + lVar14 * 8) = dVar27;
    lVar14 = lVar14 + 1;
    uVar26 = uVar17 >> 3 & 0xffffffff;
    if (dVar27 <= dVar28) {
      dVar27 = dVar28;
      uVar26 = uVar20;
    }
    uVar17 = uVar17 + 8;
  } while (lVar14 != 0x36);
  iVar22 = 0xc;
  lVar14 = 0;
  do {
    dVar37 = (double)iVar22 / (double)(iVar22 + 10);
    dVar37 = dVar37 * 0.9 * (2.0 - dVar37);
    dVar28 = (*(double *)((long)local_4088 + lVar14) + *(double *)((long)adStack_3e28 + lVar14)) *
             dVar37;
    *(double *)(alStack_41b0[2] + 0x10 + lVar14) = dVar28;
    uVar17 = (ulong)((alStack_41b0[2] - alStack_41b0[1]) + 0x10 + lVar14) >> 3 & 0xffffffff;
    if (dVar28 <= dVar27) {
      dVar28 = dVar27;
      uVar17 = uVar26;
    }
    dVar27 = (*(double *)((long)adStack_4038 + lVar14) + *(double *)((long)local_3e78 + lVar14)) *
             dVar37;
    *(double *)(alStack_41b0[0x16] + 0x60 + lVar14) = dVar27;
    uVar26 = (ulong)((alStack_41b0[0x16] - alStack_41b0[1]) + 0x60 + lVar14) >> 3 & 0xffffffff;
    if (dVar27 <= dVar28) {
      dVar27 = dVar28;
      uVar26 = uVar17;
    }
    iVar22 = iVar22 + 1;
    lVar14 = lVar14 + 8;
  } while (lVar14 != 0x1b8);
  lVar14 = 0x58;
  lVar16 = 0x58 - alStack_41b0[1];
  puVar21 = local_4040;
  lVar23 = 2;
  lVar24 = 0x1c0;
  iVar22 = 0;
  puVar25 = local_3e30;
  do {
    lVar8 = alStack_41b0[lVar23 + 1];
    lVar9 = *(long *)((long)alStack_41b0 + (ulong)(uint)((0x16 - (int)lVar23) * 8) + 8);
    iVar18 = 0xc;
    lVar19 = 0;
    do {
      dVar37 = (double)iVar18 / (double)(iVar22 + iVar18 + 9);
      dVar37 = (2.0 - dVar37) * dVar37;
      dVar28 = (*(double *)((long)local_4088 + lVar19) + *(double *)(puVar25 + lVar19)) * dVar37;
      *(double *)(lVar8 + 0x10 + lVar19) = dVar28;
      uVar17 = (ulong)(lVar19 + (0x10 - alStack_41b0[1]) + lVar8) >> 3 & 0xffffffff;
      if (dVar28 <= dVar27) {
        dVar28 = dVar27;
        uVar17 = uVar26;
      }
      dVar27 = (*(double *)(puVar21 + lVar19) + *(double *)((long)local_3e78 + lVar19)) * dVar37;
      *(double *)(lVar9 + lVar14 + lVar19) = dVar27;
      uVar26 = (ulong)(lVar19 + lVar9 + lVar16) >> 3 & 0xffffffff;
      if (dVar27 <= dVar28) {
        dVar27 = dVar28;
        uVar26 = uVar17;
      }
      iVar18 = iVar18 + 1;
      lVar19 = lVar19 + 8;
    } while (lVar24 != lVar19);
    lVar23 = lVar23 + 1;
    lVar16 = lVar16 + -8;
    lVar14 = lVar14 + -8;
    lVar24 = lVar24 + 8;
    iVar22 = iVar22 + -1;
    puVar21 = puVar21 + -8;
    puVar25 = puVar25 + -8;
  } while (lVar23 != 0xb);
  uVar15 = 0;
  uVar17 = 1;
  lVar14 = 0x198;
  do {
    lVar16 = alStack_41b0[uVar17 + 1];
    lVar23 = 0;
    do {
      dVar37 = *(double *)(lVar16 + 0x20 + lVar23);
      if ((((dVar27 * 0.6 < dVar37) &&
           (pdVar1 = (double *)(lVar16 + -0x210 + lVar23), *pdVar1 <= dVar37 && dVar37 != *pdVar1))
          && (pdVar1 = (double *)(lVar16 + -0x208 + lVar23), *pdVar1 <= dVar37 && dVar37 != *pdVar1)
          ) && ((pdVar1 = (double *)(lVar16 + 0x248 + lVar23),
                *pdVar1 <= dVar37 && dVar37 != *pdVar1 &&
                (pdVar1 = (double *)(lVar16 + 0x250 + lVar23),
                *pdVar1 <= dVar37 && dVar37 != *pdVar1)))) {
        lVar24 = (long)(int)uVar15;
        uVar15 = uVar15 + 1;
        aiStack_41d8[lVar24] = (int)((ulong)((0x20 - alStack_41b0[1]) + lVar16 + lVar23) >> 3);
        if (uVar15 == 10) goto LAB_0015f0af;
      }
      lVar23 = lVar23 + 8;
    } while (lVar14 != lVar23);
    if (10 < uVar17) break;
    uVar17 = uVar17 + 1;
    lVar14 = lVar14 + 8;
  } while (uVar15 != 10);
  if (uVar15 == 10) {
LAB_0015f0af:
    uVar15 = 10;
  }
  else {
    uVar17 = 0xc;
    lVar14 = 0;
    do {
      lVar16 = alStack_41b0[uVar17 + 1];
      lVar23 = lVar14;
      do {
        dVar37 = *(double *)(lVar16 + 0x28 + lVar23);
        if (((dVar27 * 0.6 < dVar37) &&
            (pdVar1 = (double *)(lVar16 + -0x208 + lVar23), *pdVar1 <= dVar37 && dVar37 != *pdVar1))
           && ((pdVar1 = (double *)(lVar16 + -0x200 + lVar23),
               *pdVar1 <= dVar37 && dVar37 != *pdVar1 &&
               ((pdVar1 = (double *)(lVar16 + 0x250 + lVar23),
                *pdVar1 <= dVar37 && dVar37 != *pdVar1 &&
                (pdVar1 = (double *)(lVar16 + 600 + lVar23), *pdVar1 <= dVar37 && dVar37 != *pdVar1)
                ))))) {
          lVar24 = (long)(int)uVar15;
          uVar15 = uVar15 + 1;
          aiStack_41d8[lVar24] = (int)((ulong)((0x28 - alStack_41b0[1]) + lVar16 + lVar23) >> 3);
          if (uVar15 == 10) goto LAB_0015f0af;
        }
        lVar23 = lVar23 + 8;
      } while (lVar23 != 0x1e0);
      if (0x14 < uVar17) break;
      uVar17 = uVar17 + 1;
      lVar14 = lVar14 + 8;
    } while (uVar15 != 10);
    if ((int)uVar15 < 1) {
      iVar22 = (int)uVar26;
      dVar37 = (double)(iVar22 % 0x45 + 6);
      dVar27 = dVar37 + 11.0;
      if (iVar22 % 0x45 < 0xe) {
        dVar37 = 20.0;
      }
      dVar27 = dVar27 - (double)(iVar22 / 0x45);
      goto LAB_0015fc53;
    }
  }
  uVar26 = 0;
  do {
    iVar22 = aiStack_41d8[uVar26];
    lVar14 = (long)iVar22;
    dVar37 = *(double *)(alStack_41b0[1] + -0x248 + lVar14 * 8);
    dVar27 = *(double *)(alStack_41b0[1] + -0x240 + lVar14 * 8);
    dVar28 = *(double *)(alStack_41b0[1] + -0x238 + lVar14 * 8);
    dVar47 = *(double *)(alStack_41b0[1] + -0x220 + lVar14 * 8);
    dVar33 = *(double *)(alStack_41b0[1] + -0x218 + lVar14 * 8);
    dVar46 = *(double *)(alStack_41b0[1] + -0x210 + lVar14 * 8);
    dVar2 = *(double *)(alStack_41b0[1] + 0x210 + lVar14 * 8);
    dVar3 = *(double *)(alStack_41b0[1] + 0x218 + lVar14 * 8);
    dVar4 = *(double *)(alStack_41b0[1] + 0x220 + lVar14 * 8);
    pdVar1 = (double *)(alStack_41b0[1] + -0x230 + lVar14 * 8);
    dVar10 = *pdVar1;
    dVar11 = pdVar1[1];
    dVar29 = dVar46 * -0.0006755602864 +
             dVar33 * 0.02184247643159 +
             dVar47 * -0.12203175715679 +
             dVar11 * 0.6008648410116 +
             dVar10 * 0.6008648410116 +
             dVar28 * -0.12203175715679 + dVar27 * 0.02184247643159 + dVar37 * -0.0006755602864;
    pdVar1 = (double *)(alStack_41b0[1] + -0x18 + lVar14 * 8);
    dVar5 = *pdVar1;
    dVar6 = pdVar1[1];
    pdVar1 = (double *)(alStack_41b0[1] + -8 + lVar14 * 8);
    dVar12 = *pdVar1;
    dVar44 = pdVar1[1];
    pdVar1 = (double *)(alStack_41b0[1] + 8 + lVar14 * 8);
    dVar13 = *pdVar1;
    dVar7 = pdVar1[1];
    pdVar1 = (double *)(alStack_41b0[1] + 0x18 + lVar14 * 8);
    dVar38 = *pdVar1;
    dVar31 = dVar38 * -0.0006755602864 +
             dVar7 * 0.02184247643159 +
             dVar13 * -0.12203175715679 +
             dVar44 * 0.6008648410116 +
             dVar12 * 0.6008648410116 +
             dVar6 * -0.12203175715679 +
             dVar5 * 0.02184247643159 +
             *(double *)(alStack_41b0[1] + -0x20 + lVar14 * 8) * -0.0006755602864;
    dVar35 = pdVar1[1] * -0.0006755602864 +
             dVar38 * 0.02184247643159 +
             dVar7 * -0.12203175715679 +
             dVar13 * 0.6008648410116 +
             dVar44 * 0.6008648410116 +
             dVar12 * -0.12203175715679 + dVar6 * 0.02184247643159 + dVar5 * -0.0006755602864;
    pdVar1 = (double *)(alStack_41b0[1] + 0x228 + lVar14 * 8);
    dVar38 = *pdVar1;
    dVar39 = pdVar1[1];
    dVar5 = *(double *)(alStack_41b0[1] + 0x238 + lVar14 * 8);
    dVar6 = *(double *)(alStack_41b0[1] + 0x240 + lVar14 * 8);
    dVar7 = *(double *)(alStack_41b0[1] + 0x248 + lVar14 * 8);
    dVar43 = dVar7 * -0.0006755602864 +
             dVar6 * 0.02184247643159 +
             dVar5 * -0.12203175715679 +
             dVar39 * 0.6008648410116 +
             dVar38 * 0.6008648410116 +
             dVar4 * -0.12203175715679 + dVar3 * 0.02184247643159 + dVar2 * -0.0006755602864;
    dVar40 = dVar31;
    if (dVar31 <= dVar29) {
      dVar40 = dVar29;
    }
    dVar50 = dVar35;
    if (dVar35 <= dVar40) {
      dVar50 = dVar40;
    }
    dVar45 = (double)(iVar22 % 0x45 + 6);
    dVar40 = dVar43;
    if (dVar43 <= dVar50) {
      dVar40 = dVar50;
    }
    dVar48 = (dVar45 + 11.0) - (double)(iVar22 / 0x45);
    adStack_4228[uVar26] = dVar45;
    adStack_4278[uVar26] = dVar48;
    dVar49 = dVar43;
    dVar32 = dVar10;
    dVar36 = dVar11;
    dVar41 = dVar31;
    dVar42 = dVar35;
    dVar50 = dVar29;
    if (dVar44 <= dVar40) {
      if ((dVar29 != dVar40) || (NAN(dVar29) || NAN(dVar40))) {
        if ((dVar31 != dVar40) || (NAN(dVar31) || NAN(dVar40))) {
          dVar45 = dVar45 + 0.5;
          adStack_4228[uVar26] = dVar45;
          if ((dVar35 != dVar40) || (NAN(dVar35) || NAN(dVar40))) {
            dVar48 = dVar48 + -0.5;
            adStack_4278[uVar26] = dVar48;
            pdVar1 = (double *)(alStack_41b0[1] + 0x440 + lVar14 * 8);
            dVar37 = *pdVar1;
            dVar27 = pdVar1[1];
            pdVar1 = (double *)(alStack_41b0[1] + 0x450 + lVar14 * 8);
            dVar28 = *pdVar1;
            dVar49 = pdVar1[1];
            pdVar1 = (double *)(alStack_41b0[1] + 0x460 + lVar14 * 8);
            dVar47 = *pdVar1;
            dVar33 = pdVar1[1];
            pdVar1 = (double *)(alStack_41b0[1] + 0x470 + lVar14 * 8);
            dVar46 = *pdVar1;
            dVar32 = dVar31;
            dVar36 = dVar35;
            dVar41 = dVar38;
            dVar42 = dVar39;
            dVar38 = dVar46 * -0.0006755602864 +
                     dVar33 * 0.02184247643159 +
                     dVar47 * -0.12203175715679 +
                     dVar49 * 0.6008648410116 +
                     dVar28 * 0.6008648410116 +
                     dVar27 * -0.12203175715679 +
                     dVar37 * 0.02184247643159 +
                     *(double *)(alStack_41b0[1] + 0x438 + lVar14 * 8) * -0.0006755602864;
            dVar39 = pdVar1[1] * -0.0006755602864 +
                     dVar46 * 0.02184247643159 +
                     dVar33 * -0.12203175715679 +
                     dVar47 * 0.6008648410116 +
                     dVar49 * 0.6008648410116 +
                     dVar28 * -0.12203175715679 +
                     dVar27 * 0.02184247643159 + dVar37 * -0.0006755602864;
            dVar50 = dVar44;
            dVar44 = dVar43;
          }
          else {
            dVar48 = dVar48 + 0.5;
            adStack_4278[uVar26] = dVar48;
            dVar37 = dVar38 * -0.12203175715679;
            dVar49 = dVar39;
            dVar32 = dVar29;
            dVar36 = *(double *)(alStack_41b0[1] + -0x208 + lVar14 * 8) * -0.0006755602864 +
                     dVar46 * 0.02184247643159 +
                     dVar33 * -0.12203175715679 +
                     dVar47 * 0.6008648410116 +
                     dVar11 * 0.6008648410116 +
                     dVar10 * -0.12203175715679 +
                     dVar28 * 0.02184247643159 + dVar27 * -0.0006755602864;
            dVar41 = dVar44;
            dVar42 = dVar13;
            dVar38 = dVar43;
            dVar39 = *(double *)(alStack_41b0[1] + 0x250 + lVar14 * 8) * -0.0006755602864 +
                     dVar7 * 0.02184247643159 +
                     dVar6 * -0.12203175715679 +
                     dVar5 * 0.6008648410116 +
                     dVar39 * 0.6008648410116 +
                     dVar37 + dVar4 * 0.02184247643159 + dVar3 * -0.0006755602864;
            dVar50 = dVar11;
            dVar44 = dVar35;
          }
        }
        else {
          dVar45 = dVar45 + -0.5;
          adStack_4228[uVar26] = dVar45;
          dVar48 = dVar48 + -0.5;
          adStack_4278[uVar26] = dVar48;
          dVar49 = dVar38;
          dVar32 = dVar33 * -0.0006755602864 +
                   dVar47 * 0.02184247643159 +
                   dVar11 * -0.12203175715679 +
                   dVar10 * 0.6008648410116 +
                   dVar28 * 0.6008648410116 +
                   dVar27 * -0.12203175715679 +
                   dVar37 * 0.02184247643159 +
                   *(double *)(alStack_41b0[1] + -0x250 + lVar14 * 8) * -0.0006755602864;
          dVar36 = dVar29;
          dVar41 = dVar12;
          dVar42 = dVar44;
          dVar38 = dVar6 * -0.0006755602864 +
                   dVar5 * 0.02184247643159 +
                   dVar39 * -0.12203175715679 +
                   dVar38 * 0.6008648410116 +
                   dVar4 * 0.6008648410116 +
                   dVar3 * -0.12203175715679 +
                   dVar2 * 0.02184247643159 +
                   *(double *)(alStack_41b0[1] + 0x208 + lVar14 * 8) * -0.0006755602864;
          dVar39 = dVar43;
          dVar50 = dVar10;
          dVar44 = dVar31;
        }
      }
      else {
        dVar45 = dVar45 + -0.5;
        adStack_4228[uVar26] = dVar45;
        dVar48 = dVar48 + 0.5;
        adStack_4278[uVar26] = dVar48;
        pdVar1 = (double *)(alStack_41b0[1] + -0x470 + lVar14 * 8);
        dVar37 = *pdVar1;
        dVar27 = pdVar1[1];
        pdVar1 = (double *)(alStack_41b0[1] + -0x460 + lVar14 * 8);
        dVar28 = *pdVar1;
        dVar50 = pdVar1[1];
        pdVar1 = (double *)(alStack_41b0[1] + -0x450 + lVar14 * 8);
        dVar47 = *pdVar1;
        dVar33 = pdVar1[1];
        pdVar1 = (double *)(alStack_41b0[1] + -0x440 + lVar14 * 8);
        dVar46 = *pdVar1;
        dVar49 = dVar44;
        dVar32 = dVar46 * -0.0006755602864 +
                 dVar33 * 0.02184247643159 +
                 dVar47 * -0.12203175715679 +
                 dVar50 * 0.6008648410116 +
                 dVar28 * 0.6008648410116 +
                 dVar27 * -0.12203175715679 +
                 dVar37 * 0.02184247643159 +
                 *(double *)(alStack_41b0[1] + -0x478 + lVar14 * 8) * -0.0006755602864;
        dVar36 = pdVar1[1] * -0.0006755602864 +
                 dVar46 * 0.02184247643159 +
                 dVar33 * -0.12203175715679 +
                 dVar47 * 0.6008648410116 +
                 dVar50 * 0.6008648410116 +
                 dVar28 * -0.12203175715679 + dVar27 * 0.02184247643159 + dVar37 * -0.0006755602864;
        dVar41 = dVar10;
        dVar42 = dVar11;
        dVar38 = dVar31;
        dVar39 = dVar35;
        dVar44 = dVar29;
      }
    }
    dVar28 = (dVar36 + dVar38) * 0.5 - dVar44;
    dVar27 = (dVar39 + dVar32) * 0.5 + -dVar44;
    dVar37 = (((dVar44 * -4.0 + dVar49 + dVar41 + dVar50 + dVar42) - dVar27) - dVar28) * -0.5;
    dVar27 = dVar37 - dVar27;
    if (dVar27 < 1e-07) {
LAB_0015f9e1:
      adStack_40d8[uVar26] = dVar44;
    }
    else {
      dVar47 = (((dVar42 + dVar41) - dVar50) - dVar49) * -0.5;
      dVar37 = dVar37 - dVar28;
      if (dVar27 * dVar37 - dVar47 * dVar47 < 1e-07) goto LAB_0015f9e1;
      if (dVar27 < 0.0) {
        dVar27 = sqrt(dVar27);
      }
      else {
        dVar27 = SQRT(dVar27);
      }
      dVar47 = dVar47 / dVar27;
      dVar37 = dVar37 - dVar47 * dVar47;
      if (dVar37 < 0.0) {
        dVar37 = sqrt(dVar37);
      }
      else {
        dVar37 = SQRT(dVar37);
      }
      dVar33 = (((dVar42 + dVar49) - dVar41) - dVar50) * 0.5;
      dVar46 = (((dVar42 + dVar50) - dVar41) - dVar49) * 0.5;
      dVar28 = dVar33 / dVar27;
      dVar37 = ((dVar46 - dVar28 * dVar47) / dVar37) / dVar37;
      dVar27 = ((dVar28 - dVar47 * dVar37) * 0.5) / dVar27;
      dVar37 = dVar37 * 0.5;
      dVar28 = dVar27 * dVar27 + dVar37 * dVar37;
      if (1.0 < dVar28) {
        dVar27 = dVar27 / dVar28;
      }
      dVar37 = (double)(~-(ulong)(1.0 < dVar28) & (ulong)dVar37 |
                       (ulong)(dVar37 / dVar28) & -(ulong)(1.0 < dVar28));
      adStack_40d8[uVar26] = (dVar33 * dVar27 + dVar46 * dVar37) * 0.5 + dVar44;
      adStack_4228[uVar26] = dVar45 + dVar27;
      adStack_4278[uVar26] = dVar48 + dVar37;
    }
    uVar26 = uVar26 + 1;
  } while (uVar15 != uVar26);
  uVar26 = 0;
  dVar37 = 0.0;
  do {
    dVar27 = adStack_40d8[uVar26];
    dVar28 = log(adStack_4228[uVar26] + adStack_4278[uVar26]);
    dVar28 = pow(0.85,dVar28);
    dVar28 = dVar28 * dVar27;
    iVar18 = (int)uVar26;
    if (dVar28 <= dVar37) {
      dVar28 = dVar37;
      iVar18 = iVar22;
    }
    iVar22 = iVar18;
    uVar26 = uVar26 + 1;
    dVar37 = dVar28;
  } while (uVar15 != uVar26);
  dVar28 = adStack_4228[iVar22] + adStack_4228[iVar22];
  dVar27 = adStack_4278[iVar22] + adStack_4278[iVar22];
  dVar37 = 20.0;
  if (20.0 <= dVar28) {
    dVar37 = dVar28;
  }
LAB_0015fc53:
  dVar28 = 20.0;
  if (20.0 <= dVar27) {
    dVar28 = dVar27;
  }
  auVar30._8_8_ = dVar28;
  auVar30._0_8_ = dVar37;
  auVar34 = minpd(_DAT_001a5f10,auVar30);
  *lags = auVar34._0_8_;
  *(undefined1 (*) [16])(lags + 1) = auVar34;
  lags[3] = auVar34._8_8_;
  return;
}

Assistant:

void WebRtcIsac_InitializePitch(const double *in,
                                const double old_lag,
                                const double old_gain,
                                PitchAnalysisStruct *State,
                                double *lags)
{
  double buf_dec[PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2+2];
  double ratio, log_lag, gain_bias;
  double bias;
  double corrvec1[PITCH_LAG_SPAN2];
  double corrvec2[PITCH_LAG_SPAN2];
  int m, k;
  // Allocating 10 extra entries at the begining of the CorrSurf
  double corrSurfBuff[10 + (2*PITCH_BW+3)*(PITCH_LAG_SPAN2+4)];
  double* CorrSurf[2*PITCH_BW+3];
  double *CorrSurfPtr1, *CorrSurfPtr2;
  double LagWin[3] = {0.2, 0.5, 0.98};
  int ind1, ind2, peaks_ind, peak, max_ind;
  int peaks[PITCH_MAX_NUM_PEAKS];
  double adj, gain_tmp;
  double corr, corr_max;
  double intrp_a, intrp_b, intrp_c, intrp_d;
  double peak_vals[PITCH_MAX_NUM_PEAKS];
  double lags1[PITCH_MAX_NUM_PEAKS];
  double lags2[PITCH_MAX_NUM_PEAKS];
  double T[3][3];
  int row;

  for(k = 0; k < 2*PITCH_BW+3; k++)
  {
    CorrSurf[k] = &corrSurfBuff[10 + k * (PITCH_LAG_SPAN2+4)];
  }
  /* reset CorrSurf matrix */
  memset(corrSurfBuff, 0, sizeof(double) * (10 + (2*PITCH_BW+3) * (PITCH_LAG_SPAN2+4)));

  //warnings -DH
  max_ind = 0;
  peak = 0;

  /* copy old values from state buffer */
  memcpy(buf_dec, State->dec_buffer, sizeof(double) * (PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2-PITCH_FRAME_LEN/2+2));

  /* decimation; put result after the old values */
  WebRtcIsac_DecimateAllpass(in, State->decimator_state, PITCH_FRAME_LEN,
                             &buf_dec[PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2-PITCH_FRAME_LEN/2+2]);

  /* low-pass filtering */
  for (k = PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2-PITCH_FRAME_LEN/2+2; k < PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2+2; k++)
    buf_dec[k] += 0.75 * buf_dec[k-1] - 0.25 * buf_dec[k-2];

  /* copy end part back into state buffer */
  memcpy(State->dec_buffer, buf_dec+PITCH_FRAME_LEN/2, sizeof(double) * (PITCH_CORR_LEN2+PITCH_CORR_STEP2+PITCH_MAX_LAG/2-PITCH_FRAME_LEN/2+2));

  /* compute correlation for first and second half of the frame */
  PCorr(buf_dec, corrvec1);
  PCorr(buf_dec + PITCH_CORR_STEP2, corrvec2);

  /* bias towards pitch lag of previous frame */
  log_lag = log(0.5 * old_lag);
  gain_bias = 4.0 * old_gain * old_gain;
  if (gain_bias > 0.8) gain_bias = 0.8;
  for (k = 0; k < PITCH_LAG_SPAN2; k++)
  {
    ratio = log((double) (k + (PITCH_MIN_LAG/2-2))) - log_lag;
    bias = 1.0 + gain_bias * exp(-5.0 * ratio * ratio);
    corrvec1[k] *= bias;
  }

  /* taper correlation functions */
  for (k = 0; k < 3; k++) {
    gain_tmp = LagWin[k];
    corrvec1[k] *= gain_tmp;
    corrvec2[k] *= gain_tmp;
    corrvec1[PITCH_LAG_SPAN2-1-k] *= gain_tmp;
    corrvec2[PITCH_LAG_SPAN2-1-k] *= gain_tmp;
  }

  corr_max = 0.0;
  /* fill middle row of correlation surface */
  ind1 = 0;
  ind2 = 0;
  CorrSurfPtr1 = &CorrSurf[PITCH_BW][2];
  for (k = 0; k < PITCH_LAG_SPAN2; k++) {
    corr = corrvec1[ind1++] + corrvec2[ind2++];
    CorrSurfPtr1[k] = corr;
    if (corr > corr_max) {
      corr_max = corr;  /* update maximum */
      max_ind = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
    }
  }
  /* fill first and last rows of correlation surface */
  ind1 = 0;
  ind2 = PITCH_BW;
  CorrSurfPtr1 = &CorrSurf[0][2];
  CorrSurfPtr2 = &CorrSurf[2*PITCH_BW][PITCH_BW+2];
  for (k = 0; k < PITCH_LAG_SPAN2-PITCH_BW; k++) {
    ratio = ((double) (ind1 + 12)) / ((double) (ind2 + 12));
    adj = 0.2 * ratio * (2.0 - ratio);   /* adjustment factor; inverse parabola as a function of ratio */
    corr = adj * (corrvec1[ind1] + corrvec2[ind2]);
    CorrSurfPtr1[k] = corr;
    if (corr > corr_max) {
      corr_max = corr;  /* update maximum */
      max_ind = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
    }
    corr = adj * (corrvec1[ind2++] + corrvec2[ind1++]);
    CorrSurfPtr2[k] = corr;
    if (corr > corr_max) {
      corr_max = corr;  /* update maximum */
      max_ind = (int)(&CorrSurfPtr2[k] - &CorrSurf[0][0]);
    }
  }
  /* fill second and next to last rows of correlation surface */
  ind1 = 0;
  ind2 = PITCH_BW-1;
  CorrSurfPtr1 = &CorrSurf[1][2];
  CorrSurfPtr2 = &CorrSurf[2*PITCH_BW-1][PITCH_BW+1];
  for (k = 0; k < PITCH_LAG_SPAN2-PITCH_BW+1; k++) {
    ratio = ((double) (ind1 + 12)) / ((double) (ind2 + 12));
    adj = 0.9 * ratio * (2.0 - ratio);   /* adjustment factor; inverse parabola as a function of ratio */
    corr = adj * (corrvec1[ind1] + corrvec2[ind2]);
    CorrSurfPtr1[k] = corr;
    if (corr > corr_max) {
      corr_max = corr;  /* update maximum */
      max_ind = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
    }
    corr = adj * (corrvec1[ind2++] + corrvec2[ind1++]);
    CorrSurfPtr2[k] = corr;
    if (corr > corr_max) {
      corr_max = corr;  /* update maximum */
      max_ind = (int)(&CorrSurfPtr2[k] - &CorrSurf[0][0]);
    }
  }
  /* fill remainder of correlation surface */
  for (m = 2; m < PITCH_BW; m++) {
    ind1 = 0;
    ind2 = PITCH_BW - m;         /* always larger than ind1 */
    CorrSurfPtr1 = &CorrSurf[m][2];
    CorrSurfPtr2 = &CorrSurf[2*PITCH_BW-m][PITCH_BW+2-m];
    for (k = 0; k < PITCH_LAG_SPAN2-PITCH_BW+m; k++) {
      ratio = ((double) (ind1 + 12)) / ((double) (ind2 + 12));
      adj = ratio * (2.0 - ratio);    /* adjustment factor; inverse parabola as a function of ratio */
      corr = adj * (corrvec1[ind1] + corrvec2[ind2]);
      CorrSurfPtr1[k] = corr;
      if (corr > corr_max) {
        corr_max = corr;  /* update maximum */
        max_ind = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
      }
      corr = adj * (corrvec1[ind2++] + corrvec2[ind1++]);
      CorrSurfPtr2[k] = corr;
      if (corr > corr_max) {
        corr_max = corr;  /* update maximum */
        max_ind = (int)(&CorrSurfPtr2[k] - &CorrSurf[0][0]);
      }
    }
  }

  /* threshold value to qualify as a peak */
  corr_max *= 0.6;

  peaks_ind = 0;
  /* find peaks */
  for (m = 1; m < PITCH_BW+1; m++) {
    if (peaks_ind == PITCH_MAX_NUM_PEAKS) break;
    CorrSurfPtr1 = &CorrSurf[m][2];
    for (k = 2; k < PITCH_LAG_SPAN2-PITCH_BW-2+m; k++) {
      corr = CorrSurfPtr1[k];
      if (corr > corr_max) {
        if ( (corr > CorrSurfPtr1[k - (PITCH_LAG_SPAN2+5)]) && (corr > CorrSurfPtr1[k - (PITCH_LAG_SPAN2+4)]) ) {
          if ( (corr > CorrSurfPtr1[k + (PITCH_LAG_SPAN2+4)]) && (corr > CorrSurfPtr1[k + (PITCH_LAG_SPAN2+5)]) ) {
            /* found a peak; store index into matrix */
            peaks[peaks_ind++] = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
            if (peaks_ind == PITCH_MAX_NUM_PEAKS) break;
          }
        }
      }
    }
  }
  for (m = PITCH_BW+1; m < 2*PITCH_BW; m++) {
    if (peaks_ind == PITCH_MAX_NUM_PEAKS) break;
    CorrSurfPtr1 = &CorrSurf[m][2];
    for (k = 2+m-PITCH_BW; k < PITCH_LAG_SPAN2-2; k++) {
      corr = CorrSurfPtr1[k];
      if (corr > corr_max) {
        if ( (corr > CorrSurfPtr1[k - (PITCH_LAG_SPAN2+5)]) && (corr > CorrSurfPtr1[k - (PITCH_LAG_SPAN2+4)]) ) {
          if ( (corr > CorrSurfPtr1[k + (PITCH_LAG_SPAN2+4)]) && (corr > CorrSurfPtr1[k + (PITCH_LAG_SPAN2+5)]) ) {
            /* found a peak; store index into matrix */
            peaks[peaks_ind++] = (int)(&CorrSurfPtr1[k] - &CorrSurf[0][0]);
            if (peaks_ind == PITCH_MAX_NUM_PEAKS) break;
          }
        }
      }
    }
  }

  if (peaks_ind > 0) {
    /* examine each peak */
    CorrSurfPtr1 = &CorrSurf[0][0];
    for (k = 0; k < peaks_ind; k++) {
      peak = peaks[k];

      /* compute four interpolated values around current peak */
      IntrepolFilter(&CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+5)], &intrp_a);
      IntrepolFilter(&CorrSurfPtr1[peak - 1            ], &intrp_b);
      IntrepolFilter(&CorrSurfPtr1[peak                ], &intrp_c);
      IntrepolFilter(&CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+4)], &intrp_d);

      /* determine maximum of the interpolated values */
      corr = CorrSurfPtr1[peak];
      corr_max = intrp_a;
      if (intrp_b > corr_max) corr_max = intrp_b;
      if (intrp_c > corr_max) corr_max = intrp_c;
      if (intrp_d > corr_max) corr_max = intrp_d;

      /* determine where the peak sits and fill a 3x3 matrix around it */
      row = peak / (PITCH_LAG_SPAN2+4);
      lags1[k] = (double) ((peak - row * (PITCH_LAG_SPAN2+4)) + PITCH_MIN_LAG/2 - 4);
      lags2[k] = (double) (lags1[k] + PITCH_BW - row);
      if ( corr > corr_max ) {
        T[0][0] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+5)];
        T[2][0] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+4)];
        T[1][1] = corr;
        T[0][2] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+4)];
        T[2][2] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+5)];
        T[1][0] = intrp_a;
        T[0][1] = intrp_b;
        T[2][1] = intrp_c;
        T[1][2] = intrp_d;
      } else {
        if (intrp_a == corr_max) {
          lags1[k] -= 0.5;
          lags2[k] += 0.5;
          IntrepolFilter(&CorrSurfPtr1[peak - 2*(PITCH_LAG_SPAN2+5)], &T[0][0]);
          IntrepolFilter(&CorrSurfPtr1[peak - (2*PITCH_LAG_SPAN2+9)], &T[2][0]);
          T[1][1] = intrp_a;
          T[0][2] = intrp_b;
          T[2][2] = intrp_c;
          T[1][0] = CorrSurfPtr1[peak - (2*PITCH_LAG_SPAN2+9)];
          T[0][1] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+5)];
          T[2][1] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+4)];
          T[1][2] = corr;
        } else if (intrp_b == corr_max) {
          lags1[k] -= 0.5;
          lags2[k] -= 0.5;
          IntrepolFilter(&CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+6)], &T[0][0]);
          T[2][0] = intrp_a;
          T[1][1] = intrp_b;
          IntrepolFilter(&CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+3)], &T[0][2]);
          T[2][2] = intrp_d;
          T[1][0] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+5)];
          T[0][1] = CorrSurfPtr1[peak - 1];
          T[2][1] = corr;
          T[1][2] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+4)];
        } else if (intrp_c == corr_max) {
          lags1[k] += 0.5;
          lags2[k] += 0.5;
          T[0][0] = intrp_a;
          IntrepolFilter(&CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+4)], &T[2][0]);
          T[1][1] = intrp_c;
          T[0][2] = intrp_d;
          IntrepolFilter(&CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+5)], &T[2][2]);
          T[1][0] = CorrSurfPtr1[peak - (PITCH_LAG_SPAN2+4)];
          T[0][1] = corr;
          T[2][1] = CorrSurfPtr1[peak + 1];
          T[1][2] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+5)];
        } else {
          lags1[k] += 0.5;
          lags2[k] -= 0.5;
          T[0][0] = intrp_b;
          T[2][0] = intrp_c;
          T[1][1] = intrp_d;
          IntrepolFilter(&CorrSurfPtr1[peak + 2*(PITCH_LAG_SPAN2+4)], &T[0][2]);
          IntrepolFilter(&CorrSurfPtr1[peak + (2*PITCH_LAG_SPAN2+9)], &T[2][2]);
          T[1][0] = corr;
          T[0][1] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+4)];
          T[2][1] = CorrSurfPtr1[peak + (PITCH_LAG_SPAN2+5)];
          T[1][2] = CorrSurfPtr1[peak + (2*PITCH_LAG_SPAN2+9)];
        }
      }

      /* 2D parabolic interpolation gives more accurate lags and peak value */
      Intrpol2D(T, &lags1[k], &lags2[k], &peak_vals[k]);
    }

    /* determine the highest peak, after applying a bias towards short lags */
    corr_max = 0.0;
    for (k = 0; k < peaks_ind; k++) {
      corr = peak_vals[k] * pow(PITCH_PEAK_DECAY, log(lags1[k] + lags2[k]));
      if (corr > corr_max) {
        corr_max = corr;
        peak = k;
      }
    }

    lags1[peak] *= 2.0;
    lags2[peak] *= 2.0;

    if (lags1[peak] < (double) PITCH_MIN_LAG) lags1[peak] = (double) PITCH_MIN_LAG;
    if (lags2[peak] < (double) PITCH_MIN_LAG) lags2[peak] = (double) PITCH_MIN_LAG;
    if (lags1[peak] > (double) PITCH_MAX_LAG) lags1[peak] = (double) PITCH_MAX_LAG;
    if (lags2[peak] > (double) PITCH_MAX_LAG) lags2[peak] = (double) PITCH_MAX_LAG;

    /* store lags of highest peak in output array */
    lags[0] = lags1[peak];
    lags[1] = lags1[peak];
    lags[2] = lags2[peak];
    lags[3] = lags2[peak];
  }
  else
  {
    row = max_ind / (PITCH_LAG_SPAN2+4);
    lags1[0] = (double) ((max_ind - row * (PITCH_LAG_SPAN2+4)) + PITCH_MIN_LAG/2 - 4);
    lags2[0] = (double) (lags1[0] + PITCH_BW - row);

    if (lags1[0] < (double) PITCH_MIN_LAG) lags1[0] = (double) PITCH_MIN_LAG;
    if (lags2[0] < (double) PITCH_MIN_LAG) lags2[0] = (double) PITCH_MIN_LAG;
    if (lags1[0] > (double) PITCH_MAX_LAG) lags1[0] = (double) PITCH_MAX_LAG;
    if (lags2[0] > (double) PITCH_MAX_LAG) lags2[0] = (double) PITCH_MAX_LAG;

    /* store lags of highest peak in output array */
    lags[0] = lags1[0];
    lags[1] = lags1[0];
    lags[2] = lags2[0];
    lags[3] = lags2[0];
  }
}